

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_getNextSeparatorTest_Test::TestBody
          (OpenDDLParserTest_getNextSeparatorTest_Test *this)

{
  internal iVar1;
  bool bVar2;
  ulong uVar3;
  internal *piVar4;
  undefined1 uVar5;
  undefined7 in_register_00000089;
  long lVar6;
  char tokenlist [8];
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  undefined8 local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  
  local_50 = 0x610a202c636261;
  local_38._M_dataplus._M_p._0_1_ = 1;
  local_38._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar6 = 0;
  do {
    iVar1 = local_48[lVar6 + -8];
    if ((((ulong)(byte)iVar1 < 0x2d) && ((0x130100000200U >> ((ulong)(byte)iVar1 & 0x3f) & 1) != 0))
       || (((byte)iVar1 - 0x5b < 0x23 &&
           ((0x500000001U >> ((ulong)((byte)iVar1 - 0x5b) & 0x3f) & 1) != 0)))) goto LAB_0013fba5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 7;
LAB_0013fba5:
  iVar1 = local_48[lVar6 + -8];
  uVar3 = (ulong)(byte)iVar1;
  uVar5 = uVar3 == 0x20 || uVar3 == 9;
  local_48[0] = (internal)
                ((((byte)iVar1 & 0xfe) == 0x28 || (uVar3 == 0x7d || uVar3 == 0x5b)) ||
                ((uVar3 == 0x2c || uVar3 == 0x7b) || (bool)uVar5));
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((0x2c < uVar3) || ((0x130100000200U >> (uVar3 & 0x3f) & 1) == 0)) &&
     ((0x22 < (byte)iVar1 - 0x5b ||
      ((0x500000001U >> ((ulong)((byte)iVar1 - 0x5b) & 0x3f) & 1) == 0)))) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,(AssertionResult *)0x162c67,"false","true",
               (char *)CONCAT71(in_register_00000089,uVar5));
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x5f,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      local_38._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (lVar6 == 7) {
LAB_0013fc3c:
    piVar4 = local_48 + lVar6 + -8;
  }
  else {
    piVar4 = (internal *)((long)&local_50 + 7);
    do {
      iVar1 = local_48[lVar6 + -8];
      if ((((ulong)(byte)iVar1 < 0x2d) &&
          ((0x130100000200U >> ((ulong)(byte)iVar1 & 0x3f) & 1) != 0)) ||
         (((byte)iVar1 - 0x5b < 0x23 &&
          ((0x500000001U >> ((ulong)((byte)iVar1 - 0x5b) & 0x3f) & 1) != 0)))) goto LAB_0013fc3c;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  iVar1 = *piVar4;
  uVar3 = (ulong)(byte)iVar1;
  uVar5 = uVar3 == 0x20 || uVar3 == 9;
  local_48[0] = (internal)
                ((((byte)iVar1 & 0xfe) == 0x28 || (uVar3 == 0x7d || uVar3 == 0x5b)) ||
                ((uVar3 == 0x2c || uVar3 == 0x7b) || (bool)uVar5));
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((0x2c < uVar3) || ((0x130100000200U >> (uVar3 & 0x3f) & 1) == 0)) &&
     ((0x22 < (byte)iVar1 - 0x5b ||
      ((0x500000001U >> ((ulong)((byte)iVar1 - 0x5b) & 0x3f) & 1) == 0)))) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,(AssertionResult *)0x162c67,"false","true",
               (char *)CONCAT71(in_register_00000089,uVar5));
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x62,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      local_38._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, getNextSeparatorTest) {
    char tokenlist[] = "abc, \na";
    char *in(&tokenlist[0]);
    char *end(&tokenlist[strlen("abc, \na")]);

    bool res(true);
    res = isSeparator(*in);
    EXPECT_FALSE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
}